

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O0

double getStepLength(Mesh *mesh,VectorXd *params,VectorXd *p,VectorXd *grad,double *epsilon,
                    double alpha0)

{
  bool bVar1;
  ostream *poVar2;
  void *this;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *pMVar3;
  bool in_stack_00000117;
  double in_stack_00000118;
  VectorXd *in_stack_00000120;
  Mesh *in_stack_00000128;
  double in_stack_00000168;
  VectorXd *in_stack_00000170;
  Mesh *in_stack_00000178;
  double dphi;
  double enei;
  double ene0;
  double c1;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *in_stack_fffffffffffffd78;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffd80;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  byte in_stack_fffffffffffffdaf;
  StorageBaseType *in_stack_fffffffffffffdc0;
  double *in_stack_fffffffffffffdc8;
  byte local_221;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1e8 [135];
  byte local_161;
  StorageBaseType local_130 [80];
  double local_e0;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *local_48;
  double local_40;
  undefined8 local_38;
  double local_30;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *local_10;
  double *local_8;
  
  local_38 = 0x3f1a36e2eb1c432d;
  local_30 = in_XMM0_Qa;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_40 = getEnergy(in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000117);
  Eigen::operator*(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),in_stack_fffffffffffffda0
            );
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78)
  ;
  pMVar3 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
            *)getEnergy(in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000117);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d1fa2);
  local_48 = pMVar3;
  local_e0 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
             dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                       (in_stack_fffffffffffffd80,
                        (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        in_stack_fffffffffffffd78);
  while( true ) {
    local_161 = 0;
    local_221 = 1;
    if ((double)local_48 <= local_30 * 0.0001 * local_e0 + local_40) {
      in_stack_fffffffffffffdc8 = local_8;
      Eigen::operator*(local_8,in_stack_fffffffffffffdc0);
      in_stack_fffffffffffffdc0 = local_130;
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
                ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                 CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                 in_stack_fffffffffffffda0);
      Eigen::Matrix<double,-1,1,0,-1,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80,
                 in_stack_fffffffffffffd78);
      local_161 = 1;
      bVar1 = checkCreterion(in_stack_00000178,in_stack_00000170,in_stack_00000168);
      local_221 = bVar1 ^ 0xff;
    }
    in_stack_fffffffffffffdaf = local_221;
    if ((local_161 & 1) != 0) {
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d20e1);
      in_stack_fffffffffffffdaf = local_221;
    }
    if ((in_stack_fffffffffffffdaf & 1) == 0) break;
    local_30 = local_30 * 0.5;
    in_stack_fffffffffffffd80 = local_1e8;
    in_stack_fffffffffffffd78 = local_10;
    Eigen::operator*(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
              ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
               in_stack_fffffffffffffda0);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd80,
               in_stack_fffffffffffffd78);
    in_stack_fffffffffffffda0 =
         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
          *)getEnergy(in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000117);
    local_48 = in_stack_fffffffffffffda0;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d21ba);
  }
  poVar2 = std::operator<<((ostream *)std::cout,"Step len: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_30);
  poVar2 = std::operator<<(poVar2," dphi: ");
  this = (void *)std::ostream::operator<<(poVar2,local_e0);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return local_30;
}

Assistant:

double getStepLength(const Mesh& mesh, const Eigen::VectorXd& params, const Eigen::VectorXd& p, const Eigen::VectorXd& grad, const double& epsilon, double alpha0) {
    constexpr double c1 = 1e-4;
    double ene0 = getEnergy(mesh, params, epsilon);
    double enei = getEnergy(mesh, params + alpha0 * p, epsilon);
    double dphi = p.dot(grad);
    while (enei > ene0 + c1 * alpha0 * dphi || !checkCreterion(mesh, params + alpha0 * p, epsilon)) {
        alpha0 *= 0.50;
        enei = getEnergy(mesh, params + alpha0 * p, epsilon);
    }

#ifdef TEST
    std::cout << "Step len: " << alpha0 << " dphi: " << dphi << std::endl;
#endif
    return alpha0;
}